

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

ostream * soplex::operator<<(ostream *os,SVectorBase<double> *v)

{
  bool bVar1;
  ostream *this;
  long lVar2;
  long lVar3;
  double dVar4;
  
  bVar1 = true;
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < v->memused; lVar2 = lVar2 + 1) {
    dVar4 = *(double *)((long)&v->m_elem->val + lVar3);
    if (!bVar1) {
      if (0.0 <= dVar4) {
        std::operator<<(os," + ");
        dVar4 = *(double *)((long)&v->m_elem->val + lVar3);
      }
      else {
        std::operator<<(os," - ");
        dVar4 = -*(double *)((long)&v->m_elem->val + lVar3);
      }
    }
    std::ostream::_M_insert<double>(dVar4);
    this = std::operator<<(os," x");
    std::ostream::operator<<((ostream *)this,*(int *)((long)&v->m_elem->idx + lVar3));
    if (((int)lVar2 + 1U & 3) == 0) {
      std::operator<<(os,"\n\t");
    }
    lVar3 = lVar3 + 0x10;
    bVar1 = false;
  }
  return os;
}

Assistant:

inline
std::ostream& operator<<(std::ostream& os, const SVectorBase<R>& v)
{
   for(int i = 0, j = 0; i < v.size(); ++i)
   {
      if(j)
      {
         if(v.value(i) < 0)
            os << " - " << -v.value(i);
         else
            os << " + " << v.value(i);
      }
      else
         os << v.value(i);

      os << " x" << v.index(i);
      j = 1;

      if((i + 1) % 4 == 0)
         os << "\n\t";
   }

   return os;
}